

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int ar_append(char *archive,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *files)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  FILE *pFVar4;
  allocator local_159;
  int result;
  FILE *local_138;
  FILE *file;
  char *filename;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  const_iterator fileIt;
  stat sb;
  CF cf;
  allocator local_49;
  string local_48;
  FILE *local_28;
  FILE *aFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int eval;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  char *archive_local;
  
  aFile._4_4_ = 0;
  pvStack_18 = files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)archive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,archive,&local_49);
  pFVar3 = (FILE *)cmsys::SystemTools::Fopen(&local_48,"wb+");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pFVar3 == (FILE *)0x0) {
    aFile._4_4_ = -4;
  }
  else {
    local_28 = pFVar3;
    fwrite("!<arch>\n",8,1,pFVar3);
    iVar2 = fseek(local_28,0,2);
    if (iVar2 == -1) {
      aFile._4_4_ = -3;
    }
    else {
      sb.__glibc_reserved[2] = 0;
      local_120._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvStack_18);
      while( true ) {
        filename = (char *)std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(pvStack_18);
        bVar1 = __gnu_cxx::operator!=
                          (&local_120,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&filename);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_120);
        pFVar4 = (FILE *)std::__cxx11::string::c_str();
        file = pFVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&result,(char *)pFVar4,&local_159);
        pFVar3 = (FILE *)cmsys::SystemTools::Fopen((string *)&result,"rb");
        std::__cxx11::string::~string((string *)&result);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        local_138 = pFVar3;
        if (pFVar3 == (FILE *)0x0) {
          aFile._4_4_ = -1;
        }
        else {
          sb.__glibc_reserved[2] = (__syscall_slong_t)pFVar3;
          iVar2 = put_arobj((CF *)(sb.__glibc_reserved + 2),(stat *)&fileIt);
          fclose(local_138);
          if (iVar2 != 0) {
            aFile._4_4_ = -2;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_120);
      }
    }
    fclose(local_28);
  }
  return aFile._4_4_;
}

Assistant:

static int ar_append(const char* archive,const std::vector<std::string>& files)
{
  int eval = 0;
  FILE* aFile = cmSystemTools::Fopen(archive, "wb+");
  if (aFile!=NULL) {
    fwrite(ARMAG, SARMAG, 1, aFile);
    if (fseek(aFile, 0, SEEK_END) != -1) {
      CF cf;
      struct stat sb;
      /* Read from disk, write to an archive; pad on write. */
      SETCF(NULL, 0, aFile, archive, WPAD);
      for(std::vector<std::string>::const_iterator fileIt = files.begin();
          fileIt!=files.end(); ++fileIt) {
        const char* filename = fileIt->c_str();
        FILE* file = cmSystemTools::Fopen(filename, "rb");
        if (file == NULL) {
          eval = -1;
          continue;
          }
        cf.rFile = file;
        cf.rname = filename;
        int result = put_arobj(&cf, &sb);
        (void)fclose(file);
        if (result!=0) {
          eval = -2;
          break;
          }
        }
      }
      else {
        eval = -3;
      }
    fclose(aFile);
    }
  else {
    eval = -4;
    }
  return eval;
}